

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

void alEventControlSOFT(ALsizei count,ALenum *types,ALboolean enable)

{
  anon_class_8_1_a7e9dda7 __pred;
  bool bVar1;
  __int_type _Var2;
  ALCcontext *pAVar3;
  uint *puVar4;
  atomic<unsigned_int> *paVar5;
  char in_DL;
  long in_RSI;
  uint in_EDI;
  ALbitfieldSOFT enabledevts_1;
  ALbitfieldSOFT enabledevts;
  int *bad_type;
  ALenum *types_end;
  ALbitfieldSOFT flags;
  ContextRef context;
  memory_order __b_1;
  memory_order __b;
  mutex_type *in_stack_fffffffffffffdb8;
  lock_guard<std::mutex> *in_stack_fffffffffffffdc0;
  int *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  __int_type local_d0;
  __int_type local_cc;
  intrusive_ptr<ALCcontext> local_98;
  char local_89;
  long local_88;
  uint local_80;
  __int_type local_7c;
  memory_order local_78;
  int local_74;
  atomic<unsigned_int> *local_70;
  __int_type local_64;
  memory_order local_60;
  int local_5c;
  atomic<unsigned_int> *local_58;
  undefined1 local_49;
  __int_type local_48;
  undefined4 local_44;
  
  local_89 = in_DL;
  local_88 = in_RSI;
  local_80 = in_EDI;
  GetContextRef();
  bVar1 = al::intrusive_ptr::operator_cast_to_bool((intrusive_ptr *)&local_98);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    if ((int)local_80 < 0) {
      pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_98);
      ALCcontext::setError(pAVar3,0xa003,"Controlling %d events",(ulong)local_80);
    }
    if (0 < (int)local_80) {
      if (local_88 == 0) {
        pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_98);
        ALCcontext::setError(pAVar3,0xa003,"NULL pointer");
      }
      else {
        __pred.flags._4_4_ = in_stack_fffffffffffffde4;
        __pred.flags._0_4_ = in_stack_fffffffffffffde0;
        puVar4 = (uint *)std::find_if_not<int_const*,alEventControlSOFT::__0>
                                   ((int *)CONCAT44(in_stack_fffffffffffffddc,
                                                    in_stack_fffffffffffffdd8),
                                    in_stack_fffffffffffffdd0,__pred);
        if (puVar4 == (uint *)(local_88 + (long)(int)local_80 * 4)) {
          if (local_89 == '\0') {
            pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_98);
            paVar5 = &pAVar3->mEnabledEvts;
            local_74 = 0;
            local_70 = paVar5;
            local_78 = std::operator&(memory_order_relaxed,__memory_order_mask);
            if (local_74 - 1U < 2) {
              local_7c = (paVar5->super___atomic_base<unsigned_int>)._M_i;
            }
            else if (local_74 == 5) {
              local_7c = (paVar5->super___atomic_base<unsigned_int>)._M_i;
            }
            else {
              local_7c = (paVar5->super___atomic_base<unsigned_int>)._M_i;
            }
            local_d0 = local_7c;
            do {
              pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_98);
              local_48 = local_d0;
              local_44 = 2;
              LOCK();
              _Var2 = (pAVar3->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
              local_49 = local_d0 == _Var2;
              if ((bool)local_49) {
                (pAVar3->mEnabledEvts).super___atomic_base<unsigned_int>._M_i = local_d0;
                _Var2 = local_d0;
              }
              UNLOCK();
              local_d0 = _Var2;
            } while (!(bool)local_49);
            al::intrusive_ptr<ALCcontext>::operator->(&local_98);
            std::lock_guard<std::mutex>::lock_guard
                      (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
            std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x154821);
          }
          else {
            pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_98);
            paVar5 = &pAVar3->mEnabledEvts;
            local_5c = 0;
            local_58 = paVar5;
            local_60 = std::operator&(memory_order_relaxed,__memory_order_mask);
            if (local_5c - 1U < 2) {
              local_64 = (paVar5->super___atomic_base<unsigned_int>)._M_i;
            }
            else if (local_5c == 5) {
              local_64 = (paVar5->super___atomic_base<unsigned_int>)._M_i;
            }
            else {
              local_64 = (paVar5->super___atomic_base<unsigned_int>)._M_i;
            }
            local_cc = local_64;
            do {
              pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_98);
              LOCK();
              _Var2 = (pAVar3->mEnabledEvts).super___atomic_base<unsigned_int>._M_i;
              bVar1 = local_cc == _Var2;
              if (bVar1) {
                (pAVar3->mEnabledEvts).super___atomic_base<unsigned_int>._M_i = local_cc;
                _Var2 = local_cc;
              }
              UNLOCK();
              local_cc = _Var2;
            } while (!bVar1);
          }
        }
        else {
          pAVar3 = al::intrusive_ptr<ALCcontext>::operator->(&local_98);
          ALCcontext::setError(pAVar3,0xa002,"Invalid event type 0x%04x",(ulong)*puVar4);
        }
      }
    }
  }
  al::intrusive_ptr<ALCcontext>::~intrusive_ptr
            ((intrusive_ptr<ALCcontext> *)in_stack_fffffffffffffdc0);
  return;
}

Assistant:

AL_API void AL_APIENTRY alEventControlSOFT(ALsizei count, const ALenum *types, ALboolean enable)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if(count < 0) context->setError(AL_INVALID_VALUE, "Controlling %d events", count);
    if(count <= 0) return;
    if(!types) SETERR_RETURN(context, AL_INVALID_VALUE,, "NULL pointer");

    ALbitfieldSOFT flags{0};
    const ALenum *types_end = types+count;
    auto bad_type = std::find_if_not(types, types_end,
        [&flags](ALenum type) noexcept -> bool
        {
            if(type == AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT)
                flags |= EventType_BufferCompleted;
            else if(type == AL_EVENT_TYPE_SOURCE_STATE_CHANGED_SOFT)
                flags |= EventType_SourceStateChange;
            else if(type == AL_EVENT_TYPE_DISCONNECTED_SOFT)
                flags |= EventType_Disconnected;
            else
                return false;
            return true;
        }
    );
    if(bad_type != types_end)
        SETERR_RETURN(context, AL_INVALID_ENUM,, "Invalid event type 0x%04x", *bad_type);

    if(enable)
    {
        ALbitfieldSOFT enabledevts{context->mEnabledEvts.load(std::memory_order_relaxed)};
        while(context->mEnabledEvts.compare_exchange_weak(enabledevts, enabledevts|flags,
            std::memory_order_acq_rel, std::memory_order_acquire) == 0)
        {
            /* enabledevts is (re-)filled with the current value on failure, so
             * just try again.
             */
        }
    }
    else
    {
        ALbitfieldSOFT enabledevts{context->mEnabledEvts.load(std::memory_order_relaxed)};
        while(context->mEnabledEvts.compare_exchange_weak(enabledevts, enabledevts&~flags,
            std::memory_order_acq_rel, std::memory_order_acquire) == 0)
        {
        }
        /* Wait to ensure the event handler sees the changed flags before
         * returning.
         */
        std::lock_guard<std::mutex>{context->mEventCbLock};
    }
}